

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_feedback(REF_GRID ref_grid,char *filename)

{
  int node;
  REF_INT RVar1;
  REF_MPI pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FILE *__s;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  REF_GEOM pRVar14;
  REF_INT edgeid;
  REF_DBL curve;
  REF_DBL diag;
  REF_DBL short_edge;
  REF_DBL angle;
  REF_DBL location [3];
  uint local_ac;
  uint local_a8;
  uint local_90;
  uint local_8c;
  char *local_88;
  REF_NODE local_80;
  double local_78;
  REF_DBL local_70;
  double local_68;
  double local_60;
  REF_GEOM local_58;
  REF_GRID local_50;
  REF_DBL local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  pRVar14 = ref_grid->geom;
  pRVar2 = ref_grid->mpi;
  if (pRVar14->effective != 0) {
    if (pRVar2->id == 0) {
      puts("ref_geom_feedback does not support Effective EGADS");
      return 0;
    }
    return 0;
  }
  if ((ulong)ref_grid->partitioner != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xad5,
           "ref_geom_feedback","parallel implementation is incomplete",1,
           (ulong)ref_grid->partitioner);
    return 1;
  }
  local_80 = ref_grid->node;
  if (pRVar2->id == 0) {
    puts("Triaging geometry for issues impacting efficiency and robustness");
  }
  if (pRVar2->id == 0) {
    printf("scanning for discrete face corners with slivers or cusps of %.1f deg or less\n",
           0x4024000000000000);
    puts("slivers in flat regions constrain the mesh and are efficiency concerns");
    puts("cusps (very small angles) in curved regions may be fatal with loose tolerances");
    puts("  because the edge/face topology becomes ambiguous with adaptive refinement");
  }
  local_88 = filename;
  if (pRVar14->max < 1) {
    uVar12 = 0;
  }
  else {
    lVar13 = 0;
    lVar10 = 0;
    uVar12 = 0;
    local_50 = ref_grid;
    do {
      if (*(int *)((long)pRVar14->descr + lVar13) == 0) {
        node = *(int *)((long)pRVar14->descr + lVar13 + 0x14);
        uVar6 = ref_geom_node_min_angle(ref_grid,node,&local_60);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xaee,"ref_geom_feedback",(ulong)uVar6,"node angle");
          return uVar6;
        }
        ref_grid = local_50;
        if (local_60 <= 10.0) {
          lVar9 = (long)node;
          pRVar3 = local_80->real;
          printf("%f %f %f # sliver deg=%.3f at geom node %d\n",pRVar3[lVar9 * 0xf],
                 pRVar3[lVar9 * 0xf + 1],pRVar3[lVar9 * 0xf + 2],
                 (ulong)*(uint *)((long)pRVar14->descr + lVar13 + 4));
          uVar12 = uVar12 + 1;
          ref_grid = local_50;
        }
      }
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar10 < pRVar14->max);
  }
  if (pRVar2->id == 0) {
    printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",0x4024000000000000,
           (ulong)uVar12);
  }
  if (pRVar14->model == (void *)0x0) {
    uVar6 = 0;
  }
  else {
    if (pRVar2->id == 0) {
      printf("scanning for geom nodes with shortest/longest edge ratios of %.3f or less\n",
             0x3f50624dd2f1a9fc);
      puts("short edges are efficiency concerns that rarely create failures.");
    }
    if (pRVar14->max < 1) {
      uVar6 = 0;
    }
    else {
      lVar10 = 0;
      lVar13 = 0;
      uVar6 = 0;
      local_58 = pRVar14;
      do {
        if (*(int *)((long)pRVar14->descr + lVar10) == 0) {
          RVar1 = *(REF_INT *)((long)pRVar14->descr + lVar10 + 0x14);
          uVar7 = ref_geom_node_short_edge(ref_grid,RVar1,&local_68,&local_70,(REF_INT *)&local_8c);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb09,"ref_geom_feedback",(ulong)uVar7,"short edge");
            return uVar7;
          }
          pRVar14 = local_58;
          if (local_68 <= 0.001) {
            lVar9 = (long)RVar1;
            pRVar3 = local_80->real;
            printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",pRVar3[lVar9 * 0xf],
                   pRVar3[lVar9 * 0xf + 1],pRVar3[lVar9 * 0xf + 2],local_70,(ulong)local_8c);
            uVar6 = uVar6 + 1;
            pRVar14 = local_58;
          }
        }
        lVar13 = lVar13 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar13 < pRVar14->max);
    }
    if (pRVar2->id == 0) {
      printf("%d geometry nodes with shortest/longest edge ratios of %.3f or less\n",
             0x3f50624dd2f1a9fc,(ulong)uVar6);
    }
  }
  uVar7 = 0;
  if (pRVar14->model != (void *)0x0) {
    if (pRVar2->id == 0) {
      puts("scanning for surface curvature tighter than face-edge tolerance");
      puts("tight surface curvature is ignored where it reduces mesh");
      puts("  spacing below edge and face parameter curve tolerance");
      puts("these locations are likely to be accommodated unless");
      puts("  the error estimation resolves the high surface curvature");
    }
    if (pRVar14->nedge < 1) {
      uVar7 = 0;
    }
    else {
      uVar11 = 0;
      uVar7 = 0;
      do {
        uVar11 = uVar11 + 1;
        uVar8 = ref_geom_face_curve_tol(ref_grid,uVar11,&local_78,&local_48);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xb24,"ref_geom_feedback",(ulong)uVar8,"curved face");
          return uVar8;
        }
        if (local_78 < 1.0) {
          printf("%f %f %f # curve/tol %.3e face id %d\n",local_48,local_40,local_38,(ulong)uVar11);
          uVar7 = uVar7 + 1;
        }
      } while ((int)uVar11 < pRVar14->nedge);
    }
    if (pRVar2->id == 0) {
      printf("%d locations with filtered curvature\n",(ulong)uVar7);
    }
  }
  pcVar5 = local_88;
  if (pRVar2->id != 0) {
    return 0;
  }
  if ((((int)uVar12 < 1) && ((int)uVar6 < 1)) && ((int)uVar7 < 1)) {
    return 0;
  }
  __s = fopen(local_88,"w");
  if (__s == (FILE *)0x0) {
    bVar4 = false;
    printf("unable to open %s\n",pcVar5);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xb34,
           "ref_geom_feedback","unable to open file");
    local_ac = 2;
    goto LAB_00142b84;
  }
  fwrite("title=\"tecplot refine geometry triage\"\n",0x27,1,__s);
  fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
  if ((int)uVar12 < 1) {
LAB_00142887:
    if (0 < (int)uVar6) {
      printf("exporting short edge locations to %s\n",local_88);
      fprintf(__s,"zone t=\"short edge\", i=%d, datapacking=%s\n",(ulong)uVar6,"point");
      if (pRVar14->max < 1) {
        local_a8 = 0;
      }
      else {
        lVar13 = 0;
        lVar10 = 0;
        local_a8 = 0;
        do {
          if (*(int *)((long)pRVar14->descr + lVar13) == 0) {
            RVar1 = *(REF_INT *)((long)pRVar14->descr + lVar13 + 0x14);
            local_ac = ref_geom_node_short_edge
                                 (ref_grid,RVar1,&local_68,&local_70,(REF_INT *)&local_8c);
            if (local_ac != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xb54,"ref_geom_feedback",(ulong)local_ac,"short edge");
LAB_001429bd:
              bVar4 = false;
              goto LAB_00142b84;
            }
            if (local_68 <= 0.001) {
              lVar9 = (long)RVar1;
              pRVar3 = local_80->real;
              fprintf(__s,"# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",local_70,
                      local_68,pRVar3[lVar9 * 0xf],pRVar3[lVar9 * 0xf + 1],pRVar3[lVar9 * 0xf + 2],
                      (ulong)local_8c);
              local_a8 = local_a8 + 1;
            }
          }
          lVar10 = lVar10 + 1;
          lVar13 = lVar13 + 0x18;
        } while (lVar10 < pRVar14->max);
      }
      if (uVar6 != local_a8) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xb5e,"ref_geom_feedback","tecplot short edge different recount",(ulong)uVar6,
               (long)(int)local_a8);
        goto LAB_00142b6d;
      }
    }
    local_ac = 1;
    if (0 < (int)uVar7) {
      uVar12 = 0;
      printf("exporting filtered high curvature locations to %s\n",local_88);
      fprintf(__s,"zone t=\"filtered\", i=%d, datapacking=%s\n",(ulong)uVar7,"point");
      if (0 < pRVar14->nedge) {
        uVar6 = 0;
        uVar12 = 0;
        do {
          uVar6 = uVar6 + 1;
          uVar11 = ref_geom_face_curve_tol(ref_grid,uVar6,&local_78,&local_48);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb68,"ref_geom_feedback",(ulong)uVar11,"curved face");
            local_ac = uVar11;
            goto LAB_00142b71;
          }
          if (local_78 < 1.0) {
            fprintf(__s,"# curve/tol %.3e face id %d\n%f %f %f\n",local_78,local_48,local_40,
                    local_38,(ulong)uVar6);
            uVar12 = uVar12 + 1;
          }
        } while ((int)uVar6 < pRVar14->nedge);
      }
      if (uVar7 != uVar12) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xb6f,"ref_geom_feedback","tecplot filtered curvature different recount",(ulong)uVar7
               ,(long)(int)uVar12);
        local_ac = 1;
LAB_00142b71:
        bVar4 = false;
        goto LAB_00142b84;
      }
    }
    fclose(__s);
    bVar4 = true;
  }
  else {
    printf("exporting slivers locations to %s\n",local_88);
    fprintf(__s,"zone t=\"sliver\", i=%d, datapacking=%s\n",(ulong)uVar12,"point");
    if (pRVar14->max < 1) {
      local_90 = 0;
    }
    else {
      lVar13 = 0;
      lVar10 = 0;
      local_90 = 0;
      do {
        if (*(int *)((long)pRVar14->descr + lVar13) == 0) {
          RVar1 = *(REF_INT *)((long)pRVar14->descr + lVar13 + 0x14);
          local_ac = ref_geom_node_min_angle(ref_grid,RVar1,&local_60);
          if (local_ac != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb3f,"ref_geom_feedback",(ulong)local_ac,"node angle");
            goto LAB_001429bd;
          }
          if (local_60 <= 10.0) {
            lVar9 = (long)RVar1;
            pRVar3 = local_80->real;
            fprintf(__s,"# sliver deg=%.3f at geom node %d\n %f %f %f\n",local_60,
                    pRVar3[lVar9 * 0xf],pRVar3[lVar9 * 0xf + 1],pRVar3[lVar9 * 0xf + 2],
                    (ulong)*(uint *)((long)pRVar14->descr + lVar13 + 4));
            local_90 = local_90 + 1;
          }
        }
        lVar10 = lVar10 + 1;
        lVar13 = lVar13 + 0x18;
      } while (lVar10 < pRVar14->max);
    }
    if (uVar12 == local_90) goto LAB_00142887;
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xb48,
           "ref_geom_feedback","tecplot sliver different recount",(ulong)uVar12,(long)(int)local_90)
    ;
LAB_00142b6d:
    local_ac = 1;
    bVar4 = false;
  }
LAB_00142b84:
  if (bVar4) {
    return 0;
  }
  return local_ac;
}

Assistant:

REF_FCN REF_STATUS ref_geom_feedback(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT geom, node, edgeid, faceid;
  REF_DBL angle_tol = 10.0;
  REF_DBL angle;
  REF_DBL short_edge_tol = 1e-3;
  REF_DBL short_edge, diag;
  REF_DBL curve;
  REF_DBL location[3];
  REF_INT nsliver, nshort, nfilter;

  if (ref_geom_effective(ref_geom)) {
    /* EFFECTIVE */
    if (ref_mpi_once(ref_grid_mpi(ref_grid)))
      printf("ref_geom_feedback does not support Effective EGADS\n");
    return REF_SUCCESS;
  }

  REIS(REF_MIGRATE_SINGLE, ref_grid_partitioner(ref_grid),
       "parallel implementation is incomplete");

  if (ref_mpi_once(ref_mpi))
    printf(
        "Triaging geometry for issues impacting efficiency and robustness\n");

  if (ref_mpi_once(ref_mpi)) {
    printf(
        "scanning for discrete face corners with slivers or cusps of %.1f deg "
        "or "
        "less\n",
        angle_tol);
    printf(
        "slivers in flat regions constrain the mesh and are efficiency "
        "concerns\n");
    printf(
        "cusps (very small angles) in curved regions may be fatal with loose "
        "tolerances\n");
    printf(
        "  because the edge/face topology becomes ambiguous with adaptive "
        "refinement\n");
  }
  nsliver = 0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
    if (angle <= angle_tol) {
      printf("%f %f %f # sliver deg=%.3f at geom node %d\n",
             ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
             ref_node_xyz(ref_node, 2, node), angle,
             ref_geom_id(ref_geom, geom));
      nsliver++;
    }
  }
  if (ref_mpi_once(ref_mpi))
    printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",
           nsliver, angle_tol);

  nshort = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for geom nodes with shortest/longest edge ratios of %.3f "
          "or "
          "less\n",
          short_edge_tol);
      printf(
          "short edges are efficiency concerns that rarely create failures.\n");
    }
    each_ref_geom_node(ref_geom, geom) {
      node = ref_geom_node(ref_geom, geom);
      RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag, &edgeid),
          "short edge");
      if (short_edge <= short_edge_tol) {
        printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",
               ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
               ref_node_xyz(ref_node, 2, node), diag, short_edge, edgeid);
        nshort++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf(
          "%d geometry nodes with shortest/longest edge ratios of %.3f or "
          "less\n",
          nshort, short_edge_tol);
  }

  nfilter = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for surface curvature tighter than face-edge tolerance\n");
      printf("tight surface curvature is ignored where it reduces mesh\n");
      printf("  spacing below edge and face parameter curve tolerance\n");
      printf("these locations are likely to be accommodated unless\n");
      printf("  the error estimation resolves the high surface curvature\n");
    }
    for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
      RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
          "curved face");
      if (curve < 1.0) {
        printf("%f %f %f # curve/tol %.3e face id %d\n", location[0],
               location[1], location[2], curve, faceid);
        nfilter++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf("%d locations with filtered curvature\n", nfilter);
  }

  if (ref_mpi_once(ref_mpi) && (nsliver > 0 || nshort > 0 || nfilter > 0)) {
    FILE *file;
    REF_INT n;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine geometry triage\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

    if (nsliver > 0) {
      printf("exporting slivers locations to %s\n", filename);
      fprintf(file, "zone t=\"sliver\", i=%d, datapacking=%s\n", nsliver,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
        if (angle <= angle_tol) {
          fprintf(file, "# sliver deg=%.3f at geom node %d\n %f %f %f\n", angle,
                  ref_geom_id(ref_geom, geom), ref_node_xyz(ref_node, 0, node),
                  ref_node_xyz(ref_node, 1, node),
                  ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nsliver, n, "tecplot sliver different recount");
    }

    if (nshort > 0) {
      printf("exporting short edge locations to %s\n", filename);
      fprintf(file, "zone t=\"short edge\", i=%d, datapacking=%s\n", nshort,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag,
                                     &edgeid),
            "short edge");
        if (short_edge <= short_edge_tol) {
          fprintf(
              file,
              "# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",
              diag, short_edge, edgeid, ref_node_xyz(ref_node, 0, node),
              ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nshort, n, "tecplot short edge different recount");
    }

    if (nfilter > 0) {
      printf("exporting filtered high curvature locations to %s\n", filename);
      fprintf(file, "zone t=\"filtered\", i=%d, datapacking=%s\n", nfilter,
              "point");
      n = 0;
      for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
        RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
            "curved face");
        if (curve < 1.0) {
          fprintf(file, "# curve/tol %.3e face id %d\n%f %f %f\n", curve,
                  faceid, location[0], location[1], location[2]);
          n++;
        }
      }
      REIS(nfilter, n, "tecplot filtered curvature different recount");
    }

    fclose(file);
  }
  return REF_SUCCESS;
}